

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  long lVar26;
  ulong uVar27;
  float *pfVar28;
  long lVar29;
  float *pfVar30;
  uint uVar31;
  uint uVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int remain;
  
  auVar24 = _DAT_00172270;
  auVar23 = _DAT_00172260;
  auVar22 = _DAT_00172100;
  iVar9 = top_blob->c;
  if (0 < (long)iVar9) {
    uVar10 = bottom_blob->c;
    iVar11 = top_blob->w;
    iVar12 = top_blob->h;
    pvVar14 = _kernel->data;
    pvVar15 = _bias->data;
    iVar13 = bottom_blob->w;
    iVar21 = (iVar13 - iVar11) * 2;
    lVar26 = top_blob->cstep * top_blob->elemsize;
    pvVar16 = top_blob->data;
    uVar31 = iVar12 * iVar11;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->cstep;
    sVar19 = bottom_blob->elemsize;
    lVar34 = (ulong)uVar31 - 1;
    auVar37._8_4_ = (int)lVar34;
    auVar37._0_8_ = lVar34;
    auVar37._12_4_ = (int)((ulong)lVar34 >> 0x20);
    auVar37 = auVar37 ^ _DAT_00172100;
    lVar34 = (long)pvVar16 + 0xc;
    lVar29 = 0;
    do {
      if (pvVar15 == (void *)0x0) {
        uVar38 = 0;
      }
      else {
        uVar38 = *(undefined4 *)((long)pvVar15 + lVar29 * 4);
      }
      if (0 < (int)uVar31) {
        uVar27 = 0;
        do {
          auVar39._8_4_ = (int)uVar27;
          auVar39._0_8_ = uVar27;
          auVar39._12_4_ = (int)(uVar27 >> 0x20);
          auVar40 = (auVar39 | auVar24) ^ auVar22;
          iVar25 = auVar37._4_4_;
          if ((bool)(~(iVar25 < auVar40._4_4_ ||
                      auVar37._0_4_ < auVar40._0_4_ && auVar40._4_4_ == iVar25) & 1)) {
            *(undefined4 *)(lVar34 + -0xc + uVar27 * 4) = uVar38;
          }
          if (auVar40._12_4_ <= auVar37._12_4_ &&
              (auVar40._8_4_ <= auVar37._8_4_ || auVar40._12_4_ != auVar37._12_4_)) {
            *(undefined4 *)(lVar34 + -8 + uVar27 * 4) = uVar38;
          }
          auVar39 = (auVar39 | auVar23) ^ auVar22;
          iVar36 = auVar39._4_4_;
          if (iVar36 <= iVar25 && (iVar36 != iVar25 || auVar39._0_4_ <= auVar37._0_4_)) {
            *(undefined4 *)(lVar34 + -4 + uVar27 * 4) = uVar38;
            *(undefined4 *)(lVar34 + uVar27 * 4) = uVar38;
          }
          uVar27 = uVar27 + 4;
        } while ((uVar31 + 3 & 0xfffffffc) != uVar27);
      }
      if (0 < (int)uVar10) {
        iVar25 = uVar10 * 9 * (int)lVar29;
        uVar27 = 0;
        do {
          if (0 < iVar12) {
            lVar20 = uVar27 * 0x24;
            pfVar28 = (float *)(sVar18 * sVar19 * uVar27 + (long)pvVar17);
            pfVar30 = pfVar28 + (long)iVar13 * 2;
            pfVar33 = pfVar28 + iVar13;
            iVar36 = 0;
            pfVar35 = (float *)(lVar26 * lVar29 + (long)pvVar16);
            do {
              uVar32 = iVar11 + 1;
              if (0 < iVar11) {
                do {
                  pfVar1 = pfVar28 + 1;
                  fVar6 = *pfVar28;
                  pfVar28 = pfVar28 + 2;
                  fVar7 = *pfVar33;
                  pfVar2 = pfVar33 + 1;
                  pfVar33 = pfVar33 + 2;
                  pfVar4 = (float *)((long)pvVar14 + lVar20 + (long)iVar25 * 4);
                  pfVar5 = (float *)((long)pvVar14 + lVar20 + (long)iVar25 * 4 + 0x10);
                  uVar8 = *(undefined8 *)pfVar30;
                  pfVar3 = pfVar30 + 2;
                  pfVar30 = pfVar30 + 2;
                  *pfVar35 = (float)((ulong)uVar8 >> 0x20) * pfVar5[3] + fVar7 * pfVar4[3] +
                             (float)((ulong)*(undefined8 *)pfVar2 >> 0x20) * pfVar5[1] +
                             (float)*(undefined8 *)pfVar1 * pfVar4[1] +
                             (float)uVar8 * pfVar5[2] +
                             (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) * pfVar4[2] +
                             (float)*(undefined8 *)pfVar2 * *pfVar5 + fVar6 * *pfVar4 +
                             *(float *)((long)pvVar14 + lVar20 + (long)iVar25 * 4 + 0x20) * *pfVar3
                             + *pfVar35;
                  pfVar35 = pfVar35 + 1;
                  uVar32 = uVar32 - 1;
                } while (1 < uVar32);
              }
              pfVar28 = pfVar28 + iVar21;
              pfVar33 = pfVar33 + iVar21;
              pfVar30 = pfVar30 + iVar21;
              iVar36 = iVar36 + 1;
            } while (iVar36 != iVar12);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar10);
      }
      lVar29 = lVar29 + 1;
      lVar34 = lVar34 + lVar26;
    } while (lVar29 != iVar9);
  }
  return;
}

Assistant:

static void conv3x3s2_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q = 0; q < inch; q++)
        {
            float *outptr = out;

            const float *img = bottom_blob.channel(q);
            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float *r0 = img;
            const float *r1 = img + w;
            const float *r2 = img + w * 2;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }
        }
    }
}